

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall
SQCompilation::CodegenVisitor::visitWhileStatement(CodegenVisitor *this,WhileStatement *whileLoop)

{
  SQUnsignedInteger *pSVar1;
  SQScope *pSVar2;
  size_type *psVar3;
  SQInstruction *pSVar4;
  bool bVar5;
  size_type sVar6;
  size_type sVar7;
  Node *this_00;
  SQObjectPtr *pSVar8;
  SQFuncState *funcstate;
  SQInteger SVar9;
  SQObjectPtr *pSVar10;
  long *plVar11;
  long lVar12;
  uint uVar13;
  SQFuncState *pSVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  SQScope __oldscope___1;
  SQScope __oldscope__;
  SQObjectPtr local_78;
  undefined8 local_68;
  SQTable *pSStack_60;
  ulong local_58;
  ulong local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  lVar12 = (long)(whileLoop->super_LoopStatement).super_Statement.super_Node._coordinates.lineStart;
  if (lVar12 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar12,this->_lineinfo,false);
  }
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar14 = this->_fs;
  (this->_scope).outers = pSVar14->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar14);
  (this->_scope).stacksize = SVar9;
  local_78.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_78.super_SQObject._type = OT_NULL;
  local_78.super_SQObject._flags = '\0';
  local_78.super_SQObject._5_1_ = '\0';
  local_78.super_SQObject._6_1_ = '\0';
  local_78.super_SQObject._7_1_ = '\0';
  uVar13 = (this->_scopedconsts)._size;
  uVar15 = (this->_scopedconsts)._allocated;
  if (uVar15 <= uVar13) {
    uVar13 = uVar13 * 2;
    uVar16 = 4;
    if (uVar13 != 0) {
      uVar16 = (ulong)uVar13;
    }
    pSVar10 = (SQObjectPtr *)
              sq_vm_realloc((this->_scopedconsts)._alloc_ctx,(this->_scopedconsts)._vals,
                            (ulong)uVar15 << 4,uVar16 << 4);
    (this->_scopedconsts)._vals = pSVar10;
    (this->_scopedconsts)._allocated = (size_type)uVar16;
  }
  pSVar10 = (this->_scopedconsts)._vals;
  uVar13 = (this->_scopedconsts)._size;
  (this->_scopedconsts)._size = uVar13 + 1;
  pSVar4 = (SQInstruction *)(pSVar10 + uVar13);
  pSVar4->field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)local_78.super_SQObject._type;
  pSVar4->op = local_78.super_SQObject._flags;
  pSVar4->_arg0 = local_78.super_SQObject._5_1_;
  pSVar4->_arg2 = local_78.super_SQObject._6_1_;
  pSVar4->_arg3 = local_78.super_SQObject._7_1_;
  ((SQObjectValue *)(pSVar4 + 1))->pTable = (SQTable *)local_78.super_SQObject._unVal;
  if ((pSVar10[uVar13].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar10[uVar13].super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_78);
  sVar6 = (this->_fs->_instructions)._size;
  this_00 = &whileLoop->_cond->super_Node;
  bVar5 = this->_donot_get;
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
  this->_donot_get = bVar5;
  pSVar14 = this->_fs;
  local_58 = (ulong)(pSVar14->_unresolvedbreaks)._size;
  local_50 = (ulong)(pSVar14->_unresolvedcontinues)._size;
  uVar13 = (pSVar14->_breaktargets)._allocated;
  uVar15 = (pSVar14->_breaktargets)._size;
  if (uVar13 <= uVar15) {
    uVar15 = uVar15 * 2;
    uVar16 = 4;
    if (uVar15 != 0) {
      uVar16 = (ulong)uVar15;
    }
    plVar11 = (long *)sq_vm_realloc((pSVar14->_breaktargets)._alloc_ctx,
                                    (pSVar14->_breaktargets)._vals,(ulong)uVar13 << 3,uVar16 * 8);
    (pSVar14->_breaktargets)._vals = plVar11;
    (pSVar14->_breaktargets)._allocated = (size_type)uVar16;
  }
  uVar13 = (pSVar14->_breaktargets)._size;
  (pSVar14->_breaktargets)._size = uVar13 + 1;
  (pSVar14->_breaktargets)._vals[uVar13] = 0;
  pSVar14 = this->_fs;
  uVar13 = (pSVar14->_continuetargets)._size;
  uVar15 = (pSVar14->_continuetargets)._allocated;
  if (uVar15 <= uVar13) {
    uVar13 = uVar13 * 2;
    uVar16 = 4;
    if (uVar13 != 0) {
      uVar16 = (ulong)uVar13;
    }
    plVar11 = (long *)sq_vm_realloc((pSVar14->_continuetargets)._alloc_ctx,
                                    (pSVar14->_continuetargets)._vals,(ulong)uVar15 << 3,uVar16 * 8)
    ;
    (pSVar14->_continuetargets)._vals = plVar11;
    (pSVar14->_continuetargets)._allocated = (size_type)uVar16;
  }
  pSVar2 = &this->_scope;
  uVar13 = (pSVar14->_continuetargets)._size;
  (pSVar14->_continuetargets)._size = uVar13 + 1;
  (pSVar14->_continuetargets)._vals[uVar13] = 0;
  pSVar14 = this->_fs;
  uVar13 = (pSVar14->_blockstacksizes)._size;
  uVar15 = (pSVar14->_blockstacksizes)._allocated;
  if (uVar15 <= uVar13) {
    uVar13 = uVar13 * 2;
    uVar16 = 4;
    if (uVar13 != 0) {
      uVar16 = (ulong)uVar13;
    }
    plVar11 = (long *)sq_vm_realloc((pSVar14->_blockstacksizes)._alloc_ctx,
                                    (pSVar14->_blockstacksizes)._vals,(ulong)uVar15 << 3,uVar16 * 8)
    ;
    (pSVar14->_blockstacksizes)._vals = plVar11;
    (pSVar14->_blockstacksizes)._allocated = (size_type)uVar16;
  }
  uVar13 = (pSVar14->_blockstacksizes)._size;
  (pSVar14->_blockstacksizes)._size = uVar13 + 1;
  (pSVar14->_blockstacksizes)._vals[uVar13] = (this->_scope).stacksize;
  pSVar14 = this->_fs;
  SVar9 = SQFuncState::PopTarget(pSVar14);
  local_78.super_SQObject._5_1_ = (char)SVar9;
  local_78.super_SQObject._0_5_ = 0x2700000000;
  local_78.super_SQObject._0_8_ = (ulong)local_78.super_SQObject._4_2_ << 0x20;
  SQFuncState::AddInstruction(pSVar14,(SQInstruction *)&local_78);
  pSVar14 = this->_fs;
  sVar7 = (pSVar14->_instructions)._size;
  local_78.super_SQObject._0_8_ = pSVar2->outers;
  local_78.super_SQObject._unVal = (SQObjectValue)(this->_scope).stacksize;
  (this->_scope).outers = pSVar14->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar14);
  (this->_scope).stacksize = SVar9;
  pSStack_60 = (SQTable *)0x0;
  local_68._0_4_ = (anon_union_4_2_91d81cc7_for_SQInstruction_0)0x1000001;
  local_68._4_1_ = '\0';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  uVar13 = (this->_scopedconsts)._size;
  uVar15 = (this->_scopedconsts)._allocated;
  if (uVar15 <= uVar13) {
    uVar13 = uVar13 * 2;
    uVar16 = 4;
    if (uVar13 != 0) {
      uVar16 = (ulong)uVar13;
    }
    pSVar10 = (SQObjectPtr *)
              sq_vm_realloc((this->_scopedconsts)._alloc_ctx,(this->_scopedconsts)._vals,
                            (ulong)uVar15 << 4,uVar16 << 4);
    (this->_scopedconsts)._vals = pSVar10;
    (this->_scopedconsts)._allocated = (size_type)uVar16;
  }
  uVar15 = sVar6 - 1;
  uVar16 = (ulong)(sVar7 - 1);
  pSVar8 = (this->_scopedconsts)._vals;
  uVar13 = (this->_scopedconsts)._size;
  (this->_scopedconsts)._size = uVar13 + 1;
  pSVar10 = pSVar8 + uVar13;
  (pSVar10->super_SQObject)._type = (SQObjectType)local_68._0_4_;
  (pSVar10->super_SQObject)._flags = local_68._4_1_;
  (pSVar10->super_SQObject).field_0x5 = local_68._5_1_;
  (pSVar10->super_SQObject).field_0x6 = local_68._6_1_;
  (pSVar10->super_SQObject).field_0x7 = local_68._7_1_;
  (pSVar10->super_SQObject)._unVal.pTable = pSStack_60;
  if ((pSVar8[uVar13].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((pSVar8[uVar13].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
              .super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
  Node::visit<SQCompilation::CodegenVisitor>
            (&((whileLoop->super_LoopStatement)._body)->super_Node,this);
  lVar12 = this->_fs->_outers;
  SVar9 = SQFuncState::GetStackSize(this->_fs);
  lVar17 = (this->_scope).stacksize;
  if (SVar9 != lVar17) {
    SQFuncState::SetStackSize(this->_fs,lVar17);
    if (lVar12 != this->_fs->_outers) {
      local_68._4_1_ = 'G';
      local_68._5_1_ = '\0';
      local_68._6_1_ = '\0';
      local_68._7_1_ = '\0';
      local_68._0_4_ = *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_68);
    }
  }
  pSVar2->outers = local_78.super_SQObject._0_8_;
  (this->_scope).stacksize = (SQInteger)local_78.super_SQObject._unVal;
  uVar13 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar13;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar13);
  local_68._4_1_ = '\"';
  local_68._5_1_ = '\0';
  local_68._6_1_ = '\0';
  local_68._7_1_ = '\0';
  local_68._0_4_ = uVar15 - (this->_fs->_instructions)._size;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_68);
  pSVar14 = this->_fs;
  SQFuncState::SetInstructionParam(pSVar14,uVar16,1,((pSVar14->_instructions)._size - 1) - uVar16);
  funcstate = this->_fs;
  uVar16 = (ulong)(funcstate->_unresolvedcontinues)._size;
  lVar17 = (funcstate->_unresolvedbreaks)._size - local_58;
  lVar12 = uVar16 - local_50;
  if (lVar12 != 0 && (long)local_50 <= (long)uVar16) {
    ResolveContinues((CodegenVisitor *)pSVar14,funcstate,lVar12,(ulong)uVar15);
  }
  if (0 < lVar17) {
    ResolveBreaks((CodegenVisitor *)pSVar14,this->_fs,lVar17);
  }
  pSVar14 = this->_fs;
  psVar3 = &(pSVar14->_breaktargets)._size;
  *psVar3 = *psVar3 - 1;
  psVar3 = &(pSVar14->_continuetargets)._size;
  *psVar3 = *psVar3 - 1;
  psVar3 = &(pSVar14->_blockstacksizes)._size;
  *psVar3 = *psVar3 - 1;
  lVar12 = pSVar14->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar14);
  lVar17 = (this->_scope).stacksize;
  if (SVar9 != lVar17) {
    SQFuncState::SetStackSize(this->_fs,lVar17);
    if (lVar12 != this->_fs->_outers) {
      local_78.super_SQObject._4_4_ = 0x47;
      local_78.super_SQObject._type =
           *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_78);
    }
  }
  pSVar2->outers = local_48;
  (this->_scope).stacksize = SStack_40;
  uVar13 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar13;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar13);
  return;
}

Assistant:

void CodegenVisitor::visitWhileStatement(WhileStatement *whileLoop) {
    addLineNumber(whileLoop);

    BEGIN_SCOPE();
    {
        SQInteger jmppos = _fs->GetCurrentPos();

        visitForceGet(whileLoop->condition());

        BEGIN_BREAKABLE_BLOCK();

        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());

        SQInteger jzpos = _fs->GetCurrentPos();

        BEGIN_SCOPE();

        whileLoop->body()->visit(this);

        END_SCOPE();

        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKABLE_BLOCK(jmppos);
    }
    END_SCOPE();
}